

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

piece_index_t __thiscall
libtorrent::aux::torrent::get_piece_to_super_seed
          (torrent *this,
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          *bits)

{
  peer_connection *this_00;
  bool bVar1;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> rhs;
  element_type *this_01;
  reference pppVar2;
  size_type sVar3;
  ulong uVar4;
  reference pvVar5;
  peer_connection *pc;
  peer_iterator __end3;
  peer_iterator __begin3;
  torrent *__range3;
  int availability;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_6c;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> i;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> local_60
  ;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> __end2;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> __begin2
  ;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  local_50;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *local_48;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *__range2;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  avail_vec;
  int min_availability;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *bits_local;
  torrent *this_local;
  
  avail_vec.
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 9999;
  ::std::
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ::vector((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
            *)&__range2);
  this_01 = ::std::
            __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_torrent_hot_members).m_torrent_file);
  local_50 = torrent_info::piece_range(this_01);
  local_48 = &local_50;
  local_60 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
             ::begin(local_48);
  rhs = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
        end(local_48);
  do {
    i = local_60.m_idx.m_val;
    local_6c = rhs.m_idx.m_val;
    bVar1 = libtorrent::operator!=(local_60,rhs);
    if (!bVar1) {
      bVar1 = ::std::
              vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
              ::empty((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                       *)&__range2);
      if (bVar1) {
        strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
                  ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                   ((long)&this_local + 4),-1);
      }
      else {
        sVar3 = ::std::
                vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                ::size((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                        *)&__range2);
        uVar4 = random((aux *)(ulong)((int)sVar3 - 1));
        pvVar5 = ::std::
                 vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                 ::operator[]((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                               *)&__range2,uVar4 & 0xffffffff);
        this_local._4_4_ = pvVar5->m_val;
      }
      ::std::
      vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
      ::~vector((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                 *)&__range2);
      return (piece_index_t)this_local._4_4_;
    }
    availability = (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                        ::operator*(&local_60);
    bVar1 = typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
            ::operator[](bits,(strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)
                              availability);
    if (!bVar1) {
      __range3._0_4_ = 0;
      __end3 = begin(this);
      pc = (peer_connection *)end(this);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                         *)&pc), bVar1) {
        pppVar2 = __gnu_cxx::
                  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                  ::operator*(&__end3);
        this_00 = *pppVar2;
        bVar1 = peer_connection::super_seeded_piece(this_00,(piece_index_t)availability);
        if (bVar1) {
          __range3._0_4_ = 999;
          break;
        }
        bVar1 = peer_connection::has_piece(this_00,(piece_index_t)availability);
        if (bVar1) {
          __range3._0_4_ = (int)__range3 + 1;
        }
        __gnu_cxx::
        __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
        ::operator++(&__end3);
      }
      if ((int)__range3 <=
          avail_vec.
          super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
        if ((int)__range3 ==
            avail_vec.
            super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
          ::std::
          vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          ::push_back((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                       *)&__range2,(value_type *)&availability);
        }
        else {
          avail_vec.
          super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)__range3;
          ::std::
          vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          ::clear((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                   *)&__range2);
          ::std::
          vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          ::push_back((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                       *)&__range2,(value_type *)&availability);
        }
      }
    }
    index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
    operator++(&local_60);
  } while( true );
}

Assistant:

piece_index_t torrent::get_piece_to_super_seed(typed_bitfield<piece_index_t> const& bits)
	{
		// return a piece with low availability that is not in
		// the bitfield and that is not currently being super
		// seeded by any peer
		TORRENT_ASSERT(m_super_seeding);

		// do a linear search from the first piece
		int min_availability = 9999;
		std::vector<piece_index_t> avail_vec;
		for (auto const i : m_torrent_file->piece_range())
		{
			if (bits[i]) continue;

			int availability = 0;
			for (auto* pc : *this)
			{
				if (pc->super_seeded_piece(i))
				{
					// avoid super-seeding the same piece to more than one
					// peer if we can avoid it. Do this by artificially
					// increase the availability
					availability = 999;
					break;
				}
				if (pc->has_piece(i)) ++availability;
			}
			if (availability > min_availability) continue;
			if (availability == min_availability)
			{
				avail_vec.push_back(i);
				continue;
			}
			TORRENT_ASSERT(availability < min_availability);
			min_availability = availability;
			avail_vec.clear();
			avail_vec.push_back(i);
		}

		if (avail_vec.empty()) return piece_index_t{-1};
		return avail_vec[random(std::uint32_t(avail_vec.size() - 1))];
	}